

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

int __thiscall phyr::AccelBVH::flattenBVH(AccelBVH *this,BVHTreeNode *treeNode,int *linearIdx)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  LinearBVHNode *pLVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  
  pLVar4 = this->bvhNodes;
  iVar2 = *linearIdx;
  dVar5 = (treeNode->bounds).pMin.x;
  dVar6 = (treeNode->bounds).pMin.y;
  dVar7 = (treeNode->bounds).pMin.z;
  dVar8 = (treeNode->bounds).pMax.x;
  dVar9 = (treeNode->bounds).pMax.z;
  pdVar1 = &pLVar4[iVar2].bounds.pMax.y;
  *pdVar1 = (treeNode->bounds).pMax.y;
  pdVar1[1] = dVar9;
  pdVar1 = &pLVar4[iVar2].bounds.pMin.z;
  *pdVar1 = dVar7;
  pdVar1[1] = dVar8;
  pLVar4[iVar2].bounds.pMin.x = dVar5;
  pLVar4[iVar2].bounds.pMin.y = dVar6;
  iVar3 = *linearIdx;
  *linearIdx = iVar3 + 1;
  if (treeNode->nObjects < 1) {
    pLVar4[iVar2].nObjects = 0;
    pLVar4[iVar2].splitAxis = (uint8_t)treeNode->splitAxis;
    flattenBVH(this,treeNode->child[0],linearIdx);
    iVar10 = flattenBVH(this,treeNode->child[1],linearIdx);
    pLVar4[iVar2].field_1.objectStartIdx = iVar10;
  }
  else {
    pLVar4[iVar2].field_1 = (anon_union_4_2_b6662c1c_for_LinearBVHNode_1)treeNode->startIdx;
    pLVar4[iVar2].nObjects = (uint16_t)treeNode->nObjects;
  }
  return iVar3;
}

Assistant:

int AccelBVH::flattenBVH(BVHTreeNode* treeNode, int* linearIdx) {
    // Copy data from tree node
    LinearBVHNode* linearNode = &bvhNodes[*linearIdx];

    linearNode->bounds = treeNode->bounds;
    int currentIdx = (*linearIdx)++;

    // If tree node is a leaf
    if (treeNode->nObjects > 0) {
        linearNode->objectStartIdx = treeNode->startIdx;
        linearNode->nObjects = treeNode->nObjects;
    } else {
        linearNode->nObjects = 0;
        linearNode->splitAxis = treeNode->splitAxis;
        // Recursive traverse left child
        flattenBVH(treeNode->child[0], linearIdx);
        // Store index of right child with a recursive call
        linearNode->secondChildIdx = flattenBVH(treeNode->child[1], linearIdx);
    }

    return currentIdx;
}